

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void write_vector_vector<QPDF::HPageOffsetEntry>
               (BitWriter *w,int nitems1,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec1,
               offset_in_HPageOffsetEntry_to_int nitems2,int bits,
               offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> vec2)

{
  unsigned_long uVar1;
  reference pvVar2;
  reference i;
  unsigned_long_long val;
  size_t i1;
  ulong __n;
  undefined4 in_register_00000084;
  size_t i2;
  ulong __n_00;
  int local_38;
  int local_34;
  
  _local_38 = CONCAT44(nitems1,(int)nitems2);
  __n = 0;
  while( true ) {
    uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_34);
    if (uVar1 <= __n) break;
    __n_00 = 0;
    while( true ) {
      pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (vec1,__n);
      uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                        (&pvVar2->nshared_objects);
      if (uVar1 <= __n_00) break;
      pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                         (vec1,__n);
      i = std::vector<int,_std::allocator<int>_>::at
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&pvVar2->delta_nobjects + CONCAT44(in_register_00000084,bits)),__n_00);
      val = QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::convert(i);
      uVar1 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_38);
      BitWriter::writeBits(w,val,uVar1);
      __n_00 = __n_00 + 1;
    }
    __n = __n + 1;
  }
  BitWriter::flush(w);
  return;
}

Assistant:

static void
write_vector_vector(
    BitWriter& w,
    int nitems1,
    std::vector<T>& vec1,
    int T::* nitems2,
    int bits,
    std::vector<int> T::* vec2)
{
    // nitems1 times, write nitems2 (from the ith element of vec1) items from the vec2 vector field
    // of the ith item of vec1.
    for (size_t i1 = 0; i1 < QIntC::to_size(nitems1); ++i1) {
        for (size_t i2 = 0; i2 < QIntC::to_size(vec1.at(i1).*nitems2); ++i2) {
            w.writeBits(QIntC::to_ulonglong((vec1.at(i1).*vec2).at(i2)), QIntC::to_size(bits));
        }
    }
    w.flush();
}